

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellBST::LoadableGetStateBlock_w
          (ChElementShellBST *this,int block_offset,ChStateDelta *mD)

{
  double *pdVar1;
  int iVar2;
  pointer psVar3;
  double *pdVar4;
  long lVar5;
  element_type *peVar6;
  double *pdVar7;
  long lVar8;
  ulong uVar9;
  Index index;
  long lVar10;
  ulong uVar11;
  
  if (0 < this->n_usednodes) {
    psVar3 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar4 = (mD->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    lVar5 = (mD->super_ChVectorDynamic<double>).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    iVar2 = this->n_usednodes;
    pdVar7 = pdVar4 + block_offset;
    lVar8 = 0;
    do {
      if ((block_offset < 0) || (lVar10 = lVar8 * 3 + (long)block_offset, lVar5 + -3 < lVar10)) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar1 = pdVar4 + lVar10;
      uVar11 = 3;
      if ((((ulong)pdVar1 & 7) == 0) &&
         (uVar11 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), 2 < uVar11)) {
        uVar11 = 3;
      }
      peVar6 = psVar3[this->nodes_used_to_six[lVar8]].
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (uVar11 != 0) {
        uVar9 = 0;
        do {
          pdVar7[uVar9] = *(double *)((long)&peVar6->X0 + uVar9 * 8 + 0xffffffffffffff80);
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
      }
      if (uVar11 < 3) {
        do {
          pdVar7[uVar11] = *(double *)((long)&peVar6->X0 + uVar11 * 8 + 0xffffffffffffff80);
          uVar11 = uVar11 + 1;
        } while (uVar11 != 3);
      }
      lVar8 = lVar8 + 1;
      pdVar7 = pdVar7 + 3;
    } while (lVar8 < iVar2);
  }
  return;
}

Assistant:

void ChElementShellBST::LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) {
	for (int i = 0; i < n_usednodes; ++i) {
		mD.segment(block_offset + 3 * i, 3) = m_nodes[nodes_used_to_six[i]]->GetPos_dt().eigen();
	}
}